

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_entropyCompressSeqStore
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,size_t srcSize,void *entropyWorkspace,size_t entropyWkspSize,
                 int bmi2)

{
  ZSTD_fseCTables_t *nextEntropy_00;
  byte *dstEnd;
  ZSTD_strategy ZVar1;
  ZSTD_paramSwitch_e ZVar2;
  seqDef *sequences;
  seqDef *psVar3;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  BYTE *mlCodeTable;
  BYTE *src;
  bool bVar4;
  uint disableLiteralCompression;
  size_t err_code;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  byte *pbVar8;
  uint suspectUncompressible;
  ulong nbSeq;
  ZSTD_symbolEncodingTypeStats_t stats;
  
  sequences = seqStorePtr->sequencesStart;
  psVar3 = seqStorePtr->sequences;
  nbSeq = (long)psVar3 - (long)sequences >> 3;
  ZVar1 = (cctxParams->cParams).strategy;
  ofCodeTable = seqStorePtr->ofCode;
  llCodeTable = seqStorePtr->llCode;
  mlCodeTable = seqStorePtr->mlCode;
  src = seqStorePtr->litStart;
  if (psVar3 == sequences) {
    suspectUncompressible = 1;
  }
  else {
    suspectUncompressible = (uint)(0x13 < (ulong)((long)seqStorePtr->lit - (long)src) / nbSeq);
  }
  ZVar2 = cctxParams->literalCompressionMode;
  disableLiteralCompression = 0;
  if (ZVar2 == ZSTD_ps_auto) {
    if (ZVar1 == ZSTD_fast) {
      disableLiteralCompression = (uint)((cctxParams->cParams).targetLength != 0);
    }
  }
  else if (ZVar2 != ZSTD_ps_enable) {
    if (ZVar2 != ZSTD_ps_disable) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4652,"int ZSTD_literalsCompressionIsDisabled(const ZSTD_CCtx_params *)");
    }
    disableLiteralCompression = 1;
  }
  sVar5 = ZSTD_compressLiterals
                    (dst,dstCapacity,src,(long)seqStorePtr->lit - (long)src,
                     (void *)((long)entropyWorkspace + 0xd4),0x2204,&prevEntropy->huf,
                     &nextEntropy->huf,ZVar1,disableLiteralCompression,suspectUncompressible,
                     (int)entropyWkspSize);
  pbVar8 = (byte *)dst;
  if (sVar5 < 0xffffffffffffff89) {
    if (dstCapacity < sVar5) {
      __assert_fail("cSize <= dstCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5bf9,
                    "size_t ZSTD_entropyCompressSeqStore_internal(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, void *, size_t, const int)"
                   );
    }
    pbVar8 = (byte *)((long)dst + sVar5);
  }
  sVar6 = sVar5;
  if (sVar5 < 0xffffffffffffff89) {
    dstEnd = (byte *)((long)dst + dstCapacity);
    sVar6 = 0xffffffffffffffba;
    if (3 < (long)dstEnd - (long)pbVar8) {
      if (nbSeq < 0x80) {
        *pbVar8 = (byte)nbSeq;
        pbVar8 = pbVar8 + 1;
      }
      else if (nbSeq < 0x7f00) {
        *pbVar8 = (byte)(nbSeq >> 8) | 0x80;
        pbVar8[1] = (byte)nbSeq;
        pbVar8 = pbVar8 + 2;
      }
      else {
        *pbVar8 = 0xff;
        *(short *)(pbVar8 + 1) = (short)nbSeq + -0x7f00;
        pbVar8 = pbVar8 + 3;
      }
      if (dstEnd < pbVar8) {
        __assert_fail("op <= oend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x5c0b,
                      "size_t ZSTD_entropyCompressSeqStore_internal(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, void *, size_t, const int)"
                     );
      }
      nextEntropy_00 = &nextEntropy->fse;
      if (psVar3 == sequences) {
        memcpy(nextEntropy_00,&prevEntropy->fse,0xde0);
        sVar6 = (long)pbVar8 - (long)dst;
      }
      else {
        ZSTD_buildSequencesStatistics
                  (&stats,seqStorePtr,nbSeq,&prevEntropy->fse,nextEntropy_00,pbVar8 + 1,dstEnd,ZVar1
                   ,(uint *)entropyWorkspace,(void *)((long)entropyWorkspace + 0xd4),0x2204);
        sVar6 = stats.size;
        if (stats.size < 0xffffffffffffff89) {
          *pbVar8 = (char)(stats.Offtype << 4) + (char)(stats.LLtype << 6) +
                    (char)stats.MLtype * '\x04';
          pbVar8 = pbVar8 + 1 + stats.size;
          sVar6 = ZSTD_encodeSequences
                            (pbVar8,(long)dstEnd - (long)pbVar8,(nextEntropy->fse).matchlengthCTable
                             ,mlCodeTable,nextEntropy_00->offcodeCTable,ofCodeTable,
                             (nextEntropy->fse).litlengthCTable,llCodeTable,sequences,nbSeq,
                             stats.longOffsets,(int)entropyWkspSize);
          if (sVar6 < 0xffffffffffffff89) {
            pbVar8 = pbVar8 + sVar6;
            if (dstEnd < pbVar8) {
              __assert_fail("op <= oend",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x5c29,
                            "size_t ZSTD_entropyCompressSeqStore_internal(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, void *, size_t, const int)"
                           );
            }
            bVar4 = true;
            if ((stats.lastCountSize != 0) && (sVar6 + stats.lastCountSize < 4)) {
              if (sVar6 + stats.lastCountSize != 3) {
                __assert_fail("lastCountSize + bitstreamSize == 3",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x5c34,
                              "size_t ZSTD_entropyCompressSeqStore_internal(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, void *, size_t, const int)"
                             );
              }
              bVar4 = false;
              sVar5 = 0;
            }
          }
          else {
            bVar4 = false;
            sVar5 = sVar6;
          }
          sVar6 = sVar5;
          if (bVar4) {
            sVar6 = (long)pbVar8 - (long)dst;
          }
        }
      }
    }
  }
  if ((sVar6 == 0) || ((srcSize <= dstCapacity && (sVar6 == 0xffffffffffffffba)))) {
    sVar5 = 0;
  }
  else {
    sVar5 = sVar6;
    if (sVar6 < 0xffffffffffffff89) {
      ZVar1 = (cctxParams->cParams).strategy;
      if (ZVar1 + ~ZSTD_btultra2 < 0xfffffff7) {
        __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_strategy, (int)strat)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4646,"size_t ZSTD_minGain(size_t, ZSTD_strategy)");
      }
      bVar7 = 6;
      if (ZSTD_btopt < ZVar1) {
        bVar7 = (char)ZVar1 - 1;
      }
      sVar5 = 0;
      if ((sVar6 < (srcSize - (srcSize >> (bVar7 & 0x3f))) - 2) && (sVar5 = sVar6, 0x1ffff < sVar6))
      {
        __assert_fail("cSize < ZSTD_BLOCKSIZE_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x5c60,
                      "size_t ZSTD_entropyCompressSeqStore(const seqStore_t *, const ZSTD_entropyCTables_t *, ZSTD_entropyCTables_t *, const ZSTD_CCtx_params *, void *, size_t, size_t, void *, size_t, int)"
                     );
      }
    }
  }
  return sVar5;
}

Assistant:

MEM_STATIC size_t
ZSTD_entropyCompressSeqStore(
                    const seqStore_t* seqStorePtr,
                    const ZSTD_entropyCTables_t* prevEntropy,
                          ZSTD_entropyCTables_t* nextEntropy,
                    const ZSTD_CCtx_params* cctxParams,
                          void* dst, size_t dstCapacity,
                          size_t srcSize,
                          void* entropyWorkspace, size_t entropyWkspSize,
                          int bmi2)
{
    size_t const cSize = ZSTD_entropyCompressSeqStore_internal(
                            seqStorePtr, prevEntropy, nextEntropy, cctxParams,
                            dst, dstCapacity,
                            entropyWorkspace, entropyWkspSize, bmi2);
    if (cSize == 0) return 0;
    /* When srcSize <= dstCapacity, there is enough space to write a raw uncompressed block.
     * Since we ran out of space, block must be not compressible, so fall back to raw uncompressed block.
     */
    if ((cSize == ERROR(dstSize_tooSmall)) & (srcSize <= dstCapacity)) {
        DEBUGLOG(4, "not enough dstCapacity (%zu) for ZSTD_entropyCompressSeqStore_internal()=> do not compress block", dstCapacity);
        return 0;  /* block not compressed */
    }
    FORWARD_IF_ERROR(cSize, "ZSTD_entropyCompressSeqStore_internal failed");

    /* Check compressibility */
    {   size_t const maxCSize = srcSize - ZSTD_minGain(srcSize, cctxParams->cParams.strategy);
        if (cSize >= maxCSize) return 0;  /* block not compressed */
    }
    DEBUGLOG(5, "ZSTD_entropyCompressSeqStore() cSize: %zu", cSize);
    /* libzstd decoder before  > v1.5.4 is not compatible with compressed blocks of size ZSTD_BLOCKSIZE_MAX exactly.
     * This restriction is indirectly already fulfilled by respecting ZSTD_minGain() condition above.
     */
    assert(cSize < ZSTD_BLOCKSIZE_MAX);
    return cSize;
}